

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::setSize(WindowImplX11 *this,Vector2u *size)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  undefined4 *in_RSI;
  long in_RDI;
  XSizeHints *sizeHints;
  
  if ((*(byte *)(in_RDI + 0x46c) & 1) != 0) {
    puVar2 = (undefined8 *)XAllocSizeHints();
    *puVar2 = 0x30;
    uVar1 = *in_RSI;
    *(undefined4 *)(puVar2 + 4) = uVar1;
    *(undefined4 *)(puVar2 + 3) = uVar1;
    uVar1 = in_RSI[1];
    *(undefined4 *)((long)puVar2 + 0x24) = uVar1;
    *(undefined4 *)((long)puVar2 + 0x1c) = uVar1;
    XSetWMNormalHints(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),puVar2);
    XFree(puVar2);
  }
  XResizeWindow(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),*in_RSI,in_RSI[1]);
  XFlush(*(undefined8 *)(in_RDI + 0x3d0));
  return;
}

Assistant:

void WindowImplX11::setSize(const Vector2u& size)
{
    // If resizing is disable for the window we have to update the size hints (required by some window managers).
    if (m_useSizeHints)
    {
        XSizeHints* sizeHints = XAllocSizeHints();
        sizeHints->flags = PMinSize | PMaxSize;
        sizeHints->min_width = sizeHints->max_width = size.x;
        sizeHints->min_height = sizeHints->max_height = size.y;
        XSetWMNormalHints(m_display, m_window, sizeHints);
        XFree(sizeHints);
    }

    XResizeWindow(m_display, m_window, size.x, size.y);
    XFlush(m_display);
}